

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O3

void uS::Socket::io_cb<uWS::WebSocket<true>>(uv_poll_t *p,int status,int events)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  ulong in_RAX;
  ssize_t sVar4;
  int *piVar5;
  long *plVar6;
  Socket unaff_retaddr;
  undefined8 local_38;
  
  if (status < 0) {
    uWS::WebSocket<true>::onEnd(unaff_retaddr);
    return;
  }
  plVar2 = (long *)p->data;
  lVar3 = *plVar2;
  local_38 = in_RAX;
  if (((events & 2U) != 0) && (plVar2[4] != 0)) {
    plVar1 = plVar2 + 4;
    local_38 = CONCAT44((int)(in_RAX >> 0x20),1);
    setsockopt((p->io_watcher).fd,6,3,&local_38,4);
    plVar6 = (long *)*plVar1;
    while( true ) {
      sVar4 = send((p->io_watcher).fd,(void *)*plVar6,plVar6[1],0x4000);
      if (sVar4 != plVar6[1]) break;
      if ((code *)plVar6[3] != (code *)0x0) {
        (*(code *)plVar6[3])(p,plVar6[4],0,plVar6[5]);
      }
      plVar6 = *(long **)(*plVar1 + 0x10);
      operator_delete__((void *)*plVar1);
      if (plVar6 == (long *)0x0) {
        *plVar1 = 0;
        plVar2[5] = 0;
        *(undefined4 *)(plVar2 + 3) = 1;
        uv_poll_start(p,1,p->poll_cb);
        goto LAB_00113818;
      }
      *plVar1 = (long)plVar6;
    }
    if (sVar4 == -1) {
      piVar5 = __errno_location();
      if (*piVar5 != 0xb) goto LAB_0011386d;
    }
    else {
      plVar6[1] = plVar6[1] - sVar4;
      *plVar6 = *plVar6 + sVar4;
    }
LAB_00113818:
    local_38 = local_38 & 0xffffffff;
    setsockopt((p->io_watcher).fd,6,3,(void *)((long)&local_38 + 4),4);
  }
  if ((events & 1U) == 0) {
    return;
  }
  sVar4 = recv((p->io_watcher).fd,*(void **)(lVar3 + 8),(long)*(int *)(lVar3 + 0x10),0);
  if (0 < (int)sVar4) {
    uWS::WebSocket<true>::onData((Socket)p,*(char **)(lVar3 + 8),(int)sVar4);
    return;
  }
LAB_0011386d:
  uWS::WebSocket<true>::onEnd((Socket)0x113875);
  return;
}

Assistant:

static void io_cb(uv_poll_t *p, int status, int events) {
        SocketData *socketData = Socket(p).getSocketData();
        NodeData *nodeData = socketData->nodeData;

        if (status < 0) {
            STATE::onEnd(p);
            return;
        }

        if (events & UV_WRITABLE) {
            if (!socketData->messageQueue.empty() && (events & UV_WRITABLE)) {
                Socket(p).cork(true);
                while (true) {
                    SocketData::Queue::Message *messagePtr = socketData->messageQueue.front();
                    ssize_t sent = ::send(Socket(p).getFd(), messagePtr->data, messagePtr->length, MSG_NOSIGNAL);
                    if (sent == (ssize_t) messagePtr->length) {
                        if (messagePtr->callback) {
                            messagePtr->callback(p, messagePtr->callbackData, false, messagePtr->reserved);
                        }
                        socketData->messageQueue.pop();
                        if (socketData->messageQueue.empty()) {
                            // todo, remove bit, don't set directly
                            socketData->poll = UV_READABLE;
                            uv_poll_start(p, UV_READABLE, Socket(p).getPollCallback());
                            break;
                        }
                    } else if (sent == SOCKET_ERROR) {
                        if (errno != EWOULDBLOCK) {
                            STATE::onEnd(p);
                            return;
                        }
                        break;
                    } else {
                        messagePtr->length -= sent;
                        messagePtr->data += sent;
                        break;
                    }
                }
                Socket(p).cork(false);
            }
        }

        if (events & UV_READABLE) {
            int length = recv(Socket(p).getFd(), nodeData->recvBuffer, nodeData->recvLength, 0);
            if (length > 0) {
                STATE::onData(p, nodeData->recvBuffer, length);
            } else if (length <= 0 || (length == SOCKET_ERROR && errno != EWOULDBLOCK)) {
                STATE::onEnd(p);
            }
        }

    }